

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data_collection.cpp
# Opt level: O3

void duckdb::ColumnDataCopy<duckdb::list_entry_t>
               (ColumnDataMetaData *meta_data,UnifiedVectorFormat *source_data,Vector *source,
               idx_t offset,idx_t copy_count)

{
  ColumnDataCollectionSegment *pCVar1;
  ColumnDataAppendState *state;
  sel_t *psVar2;
  unsigned_long *puVar3;
  undefined8 uVar4;
  data_ptr_t pdVar5;
  byte bVar6;
  element_type *peVar7;
  list_entry_t *source_data_1;
  Vector *this;
  reference pvVar8;
  VectorDataIndex VVar9;
  VectorChildIndex VVar10;
  reference pvVar11;
  reference pvVar12;
  ColumnDataAllocator *pCVar13;
  data_ptr_t pdVar14;
  ulong uVar15;
  TemplatedValidityData<unsigned_long> *pTVar16;
  ulong uVar17;
  _Head_base<0UL,_unsigned_long_*,_false> _Var18;
  idx_t __n;
  idx_t iVar19;
  long lVar20;
  ushort uVar21;
  long lVar22;
  idx_t iVar23;
  ColumnDataCollectionSegment *segment;
  ColumnDataAppendState *append_state;
  SelectionVector sel;
  ConsecutiveChildListInfo info;
  Vector sliced_child_vector;
  UnifiedVectorFormat child_vector_data;
  idx_t local_198;
  SelectionVector local_158;
  ConsecutiveChildListInfo local_140;
  ulong local_128;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_120;
  _Head_base<0UL,_unsigned_long_*,_false> local_118;
  LogicalType local_110 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b8;
  long local_b0;
  ColumnDataMetaData local_a8;
  UnifiedVectorFormat local_78;
  
  pCVar1 = meta_data->segment;
  this = ListVector::GetEntry(source);
  pvVar8 = vector<duckdb::VectorMetaData,_true>::operator[]
                     (&meta_data->segment->vector_data,(meta_data->vector_data_index).index);
  if ((pvVar8->child_index).index == 0xffffffffffffffff) {
    VVar9 = ColumnDataCollectionSegment::AllocateVector
                      (pCVar1,&this->type,meta_data->chunk_data,
                       &meta_data->state->current_chunk_state,(VectorDataIndex)0xffffffffffffffff);
    VVar10 = ColumnDataCollectionSegment::AddChildIndex(meta_data->segment,VVar9);
    pvVar8 = vector<duckdb::VectorMetaData,_true>::operator[]
                       (&meta_data->segment->vector_data,(meta_data->vector_data_index).index);
    (pvVar8->child_index).index = VVar10.index;
  }
  iVar23 = 0;
  pvVar11 = vector<duckdb::ColumnDataCopyFunction,_true>::operator[]
                      (&meta_data->copy_function->child_functions,0);
  pvVar8 = vector<duckdb::VectorMetaData,_true>::operator[]
                     (&meta_data->segment->vector_data,(meta_data->vector_data_index).index);
  pvVar12 = vector<duckdb::VectorDataIndex,_true>::operator[]
                      (&pCVar1->child_indices,(pvVar8->child_index).index);
  iVar19 = pvVar12->index;
  if (iVar19 != 0xffffffffffffffff) {
    iVar23 = 0;
    __n = iVar19;
    do {
      pvVar8 = vector<duckdb::VectorMetaData,_true>::operator[](&pCVar1->vector_data,__n);
      iVar23 = iVar23 + pvVar8->count;
      __n = (pvVar8->next_data).index;
    } while (__n != 0xffffffffffffffff);
  }
  UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
  local_a8.segment = meta_data->segment;
  local_a8.state = meta_data->state;
  local_a8.chunk_data = meta_data->chunk_data;
  local_a8.child_list_size = 0xffffffffffffffff;
  local_a8.copy_function = pvVar11;
  local_a8.vector_data_index.index = iVar19;
  ListVector::GetConsecutiveChildListInfo(&local_140,source,offset,copy_count);
  if (local_140.needs_slicing == true) {
    SelectionVector::SelectionVector(&local_158,local_140.child_list_info.length);
    ListVector::GetConsecutiveChildSelVector(source,&local_158,offset,copy_count);
    Vector::Vector((Vector *)&local_118,this,&local_158,local_140.child_list_info.length);
    Vector::Flatten((Vector *)&local_118,local_140.child_list_info.length);
    local_140.child_list_info.offset = 0;
    Vector::ToUnifiedFormat((Vector *)&local_118,local_140.child_list_info.length,&local_78);
    (*pvVar11->function)
              (&local_a8,&local_78,(Vector *)&local_118,local_140.child_list_info.offset,
               local_140.child_list_info.length);
    if (local_b8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b8._M_pi);
    }
    if (local_c8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c8._M_pi);
    }
    if (local_e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e0._M_pi);
    }
    LogicalType::~LogicalType(local_110);
    if (local_158.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_158.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
  }
  else {
    Vector::ToUnifiedFormat(this,local_140.child_list_info.length,&local_78);
    (*pvVar11->function)
              (&local_a8,&local_78,this,local_140.child_list_info.offset,
               local_140.child_list_info.length);
  }
  meta_data->child_list_size = iVar23;
  pCVar1 = meta_data->segment;
  state = meta_data->state;
  local_198 = offset;
  if (local_140.is_constant == true) {
    if (copy_count != 0) {
      VVar9.index = (meta_data->vector_data_index).index;
      do {
        pvVar8 = vector<duckdb::VectorMetaData,_true>::operator[](&pCVar1->vector_data,VVar9.index);
        uVar15 = (ulong)(0x800 - pvVar8->count);
        uVar17 = copy_count;
        if (uVar15 < copy_count) {
          uVar17 = uVar15;
        }
        pCVar13 = shared_ptr<duckdb::ColumnDataAllocator,_true>::operator->(&pCVar1->allocator);
        pdVar14 = ColumnDataAllocator::GetDataPointer
                            (pCVar13,&state->current_chunk_state,pvVar8->block_id,pvVar8->offset);
        _Var18._M_head_impl = (unsigned_long *)(pdVar14 + 0x8000);
        local_110[0]._0_8_ = (element_type *)0x0;
        local_110[0].type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_110[0].type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
        uVar21 = pvVar8->count;
        local_118._M_head_impl = _Var18._M_head_impl;
        if (uVar21 == 0) {
          switchD_005681f0::default(_Var18._M_head_impl,0xff,0x100);
        }
        if ((source_data->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          if (uVar15 != 0) {
            pdVar5 = source_data->data;
            psVar2 = source_data->sel->sel_vector;
            lVar20 = 0;
            iVar19 = local_198;
            do {
              iVar23 = iVar19;
              if (psVar2 != (sel_t *)0x0) {
                iVar23 = (idx_t)psVar2[iVar19];
              }
              uVar4 = *(undefined8 *)(pdVar5 + iVar23 * 0x10 + 8);
              *(idx_t *)(pdVar14 + lVar20 + (ulong)uVar21 * 0x10) = meta_data->child_list_size;
              *(undefined8 *)(pdVar14 + lVar20 + (ulong)uVar21 * 0x10 + 8) = uVar4;
              lVar20 = lVar20 + 0x10;
              iVar19 = iVar19 + 1;
            } while ((uVar17 + (uVar17 == 0)) * 0x10 != lVar20);
          }
        }
        else if (uVar15 != 0) {
          pdVar14 = pdVar14 + 8;
          lVar20 = local_198 * 4;
          lVar22 = 0;
          local_128 = copy_count;
          local_b0 = lVar20;
          do {
            psVar2 = source_data->sel->sel_vector;
            if (psVar2 == (sel_t *)0x0) {
              uVar15 = local_198 + lVar22;
            }
            else {
              uVar15 = (ulong)*(uint *)((long)psVar2 + lVar22 * 4 + lVar20);
            }
            puVar3 = (source_data->validity).super_TemplatedValidityMask<unsigned_long>.
                     validity_mask;
            if (puVar3 == (unsigned_long *)0x0) {
              uVar21 = pvVar8->count;
LAB_002b6c90:
              uVar4 = *(undefined8 *)(source_data->data + uVar15 * 0x10 + 8);
              *(idx_t *)(pdVar14 + (ulong)uVar21 * 0x10 + -8) = meta_data->child_list_size;
              *(undefined8 *)(pdVar14 + (ulong)uVar21 * 0x10) = uVar4;
            }
            else {
              uVar21 = pvVar8->count;
              if ((puVar3[uVar15 >> 6] >> (uVar15 & 0x3f) & 1) != 0) goto LAB_002b6c90;
              if (_Var18._M_head_impl == (unsigned_long *)0x0) {
                local_120 = local_110[0].type_info_.internal.
                            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi;
                make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                          ((duckdb *)&local_158,(unsigned_long *)&local_120);
                peVar7 = local_110[0].type_info_.internal.
                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr;
                local_110[0].type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)
                     local_158.selection_data.internal.
                     super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                local_110[0]._0_8_ = local_158.sel_vector;
                local_158.sel_vector = (sel_t *)0x0;
                local_158.selection_data.internal.
                super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)0x0;
                if ((peVar7 != (element_type *)0x0) &&
                   (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar7),
                   (element_type *)
                   local_158.selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                   (element_type *)0x0)) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             local_158.selection_data.internal.
                             super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr);
                }
                pTVar16 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                    ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>
                                      *)local_110);
                _Var18._M_head_impl =
                     (pTVar16->owned_data).
                     super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                     super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                     super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                lVar20 = local_b0;
                local_118._M_head_impl = _Var18._M_head_impl;
              }
              bVar6 = (byte)((ulong)uVar21 + lVar22) & 0x3f;
              _Var18._M_head_impl[(ulong)uVar21 + lVar22 >> 6] =
                   _Var18._M_head_impl[(ulong)uVar21 + lVar22 >> 6] &
                   (-2L << bVar6 | 0xfffffffffffffffeU >> 0x40 - bVar6);
            }
            lVar22 = lVar22 + 1;
            pdVar14 = pdVar14 + 0x10;
          } while (uVar17 + (uVar17 == 0) != lVar22);
          uVar21 = pvVar8->count;
          copy_count = local_128;
        }
        pvVar8->count = uVar21 + (short)uVar17;
        copy_count = copy_count - uVar17;
        if (copy_count != 0) {
          if ((pvVar8->next_data).index == 0xffffffffffffffff) {
            ColumnDataCollectionSegment::AllocateVector
                      (pCVar1,&source->type,meta_data->chunk_data,&state->current_chunk_state,VVar9)
            ;
          }
          pvVar8 = vector<duckdb::VectorMetaData,_true>::operator[]
                             (&pCVar1->vector_data,VVar9.index);
          VVar9.index = (pvVar8->next_data).index;
        }
        if (local_110[0].type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_110[0].type_info_.internal.
                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        }
        local_198 = local_198 + uVar17;
      } while (copy_count != 0);
    }
  }
  else if (copy_count != 0) {
    VVar9.index = (meta_data->vector_data_index).index;
    do {
      pvVar8 = vector<duckdb::VectorMetaData,_true>::operator[](&pCVar1->vector_data,VVar9.index);
      uVar15 = (ulong)(0x800 - pvVar8->count);
      uVar17 = copy_count;
      if (uVar15 < copy_count) {
        uVar17 = uVar15;
      }
      pCVar13 = shared_ptr<duckdb::ColumnDataAllocator,_true>::operator->(&pCVar1->allocator);
      pdVar14 = ColumnDataAllocator::GetDataPointer
                          (pCVar13,&state->current_chunk_state,pvVar8->block_id,pvVar8->offset);
      _Var18._M_head_impl = (unsigned_long *)(pdVar14 + 0x8000);
      local_110[0]._0_8_ = (element_type *)0x0;
      local_110[0].type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_110[0].type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
      uVar21 = pvVar8->count;
      local_118._M_head_impl = _Var18._M_head_impl;
      if (uVar21 == 0) {
        switchD_005681f0::default(_Var18._M_head_impl,0xff,0x100);
      }
      if ((source_data->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) {
        if (uVar15 != 0) {
          pdVar5 = source_data->data;
          psVar2 = source_data->sel->sel_vector;
          lVar20 = 0;
          iVar19 = local_198;
          do {
            iVar23 = iVar19;
            if (psVar2 != (sel_t *)0x0) {
              iVar23 = (idx_t)psVar2[iVar19];
            }
            lVar22 = *(long *)(pdVar5 + iVar23 * 0x10 + 8);
            iVar23 = meta_data->child_list_size;
            meta_data->child_list_size = iVar23 + lVar22;
            *(idx_t *)(pdVar14 + lVar20 + (ulong)uVar21 * 0x10) = iVar23;
            *(long *)(pdVar14 + lVar20 + (ulong)uVar21 * 0x10 + 8) = lVar22;
            lVar20 = lVar20 + 0x10;
            iVar19 = iVar19 + 1;
          } while ((uVar17 + (uVar17 == 0)) * 0x10 != lVar20);
        }
      }
      else if (uVar15 != 0) {
        pdVar14 = pdVar14 + 8;
        lVar20 = 0;
        local_128 = copy_count;
        do {
          psVar2 = source_data->sel->sel_vector;
          if (psVar2 == (sel_t *)0x0) {
            uVar15 = local_198 + lVar20;
          }
          else {
            uVar15 = (ulong)psVar2[local_198 + lVar20];
          }
          puVar3 = (source_data->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar3 == (unsigned_long *)0x0) {
            uVar21 = pvVar8->count;
LAB_002b6f9f:
            lVar22 = *(long *)(source_data->data + uVar15 * 0x10 + 8);
            iVar19 = meta_data->child_list_size;
            meta_data->child_list_size = iVar19 + lVar22;
            *(idx_t *)(pdVar14 + (ulong)uVar21 * 0x10 + -8) = iVar19;
            *(long *)(pdVar14 + (ulong)uVar21 * 0x10) = lVar22;
          }
          else {
            uVar21 = pvVar8->count;
            if ((puVar3[uVar15 >> 6] >> (uVar15 & 0x3f) & 1) != 0) goto LAB_002b6f9f;
            if (_Var18._M_head_impl == (unsigned_long *)0x0) {
              local_120 = local_110[0].type_info_.internal.
                          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi;
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                        ((duckdb *)&local_158,(unsigned_long *)&local_120);
              peVar7 = local_110[0].type_info_.internal.
                       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              local_110[0].type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)
                   local_158.selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              local_110[0]._0_8_ = local_158.sel_vector;
              local_158.sel_vector = (sel_t *)0x0;
              local_158.selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)0x0;
              if ((peVar7 != (element_type *)0x0) &&
                 (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar7),
                 (element_type *)
                 local_158.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                 (element_type *)0x0)) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_158.selection_data.internal.
                           super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr);
              }
              pTVar16 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                  ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *
                                   )local_110);
              _Var18._M_head_impl =
                   (pTVar16->owned_data).
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                   super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
              local_118._M_head_impl = _Var18._M_head_impl;
            }
            bVar6 = (byte)((ulong)uVar21 + lVar20) & 0x3f;
            _Var18._M_head_impl[(ulong)uVar21 + lVar20 >> 6] =
                 _Var18._M_head_impl[(ulong)uVar21 + lVar20 >> 6] &
                 (-2L << bVar6 | 0xfffffffffffffffeU >> 0x40 - bVar6);
          }
          lVar20 = lVar20 + 1;
          pdVar14 = pdVar14 + 0x10;
        } while (uVar17 + (uVar17 == 0) != lVar20);
        uVar21 = pvVar8->count;
        copy_count = local_128;
      }
      pvVar8->count = uVar21 + (short)uVar17;
      copy_count = copy_count - uVar17;
      if (copy_count != 0) {
        if ((pvVar8->next_data).index == 0xffffffffffffffff) {
          ColumnDataCollectionSegment::AllocateVector
                    (pCVar1,&source->type,meta_data->chunk_data,&state->current_chunk_state,VVar9);
        }
        pvVar8 = vector<duckdb::VectorMetaData,_true>::operator[](&pCVar1->vector_data,VVar9.index);
        VVar9.index = (pvVar8->next_data).index;
      }
      if (local_110[0].type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_110[0].type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      }
      local_198 = local_198 + uVar17;
    } while (copy_count != 0);
  }
  if (local_78.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

void ColumnDataCopy<list_entry_t>(ColumnDataMetaData &meta_data, const UnifiedVectorFormat &source_data, Vector &source,
                                  idx_t offset, idx_t copy_count) {

	auto &segment = meta_data.segment;

	auto &child_vector = ListVector::GetEntry(source);
	auto &child_type = child_vector.GetType();

	if (!meta_data.GetVectorMetaData().child_index.IsValid()) {
		auto child_index = segment.AllocateVector(child_type, meta_data.chunk_data, meta_data.state);
		meta_data.GetVectorMetaData().child_index = meta_data.segment.AddChildIndex(child_index);
	}

	auto &child_function = meta_data.copy_function.child_functions[0];
	auto child_index = segment.GetChildIndex(meta_data.GetVectorMetaData().child_index);

	// figure out the current list size by traversing the set of child entries
	idx_t current_list_size = 0;
	auto current_child_index = child_index;
	while (current_child_index.IsValid()) {
		auto &child_vdata = segment.GetVectorData(current_child_index);
		current_list_size += child_vdata.count;
		current_child_index = child_vdata.next_data;
	}

	// set the child vector
	UnifiedVectorFormat child_vector_data;
	ColumnDataMetaData child_meta_data(child_function, meta_data, child_index);
	auto info = ListVector::GetConsecutiveChildListInfo(source, offset, copy_count);

	if (info.needs_slicing) {
		SelectionVector sel(info.child_list_info.length);
		ListVector::GetConsecutiveChildSelVector(source, sel, offset, copy_count);

		auto sliced_child_vector = Vector(child_vector, sel, info.child_list_info.length);
		sliced_child_vector.Flatten(info.child_list_info.length);
		info.child_list_info.offset = 0;

		sliced_child_vector.ToUnifiedFormat(info.child_list_info.length, child_vector_data);
		child_function.function(child_meta_data, child_vector_data, sliced_child_vector, info.child_list_info.offset,
		                        info.child_list_info.length);

	} else {
		child_vector.ToUnifiedFormat(info.child_list_info.length, child_vector_data);
		child_function.function(child_meta_data, child_vector_data, child_vector, info.child_list_info.offset,
		                        info.child_list_info.length);
	}

	// now copy the list entries
	meta_data.child_list_size = current_list_size;
	if (info.is_constant) {
		TemplatedColumnDataCopy<ConstListValueCopy>(meta_data, source_data, source, offset, copy_count);
	} else {
		TemplatedColumnDataCopy<ListValueCopy>(meta_data, source_data, source, offset, copy_count);
	}
}